

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O0

void lj_dispatch_init(GG_State *GG)

{
  ushort uVar1;
  ASMFunction *disp;
  uint32_t i;
  GG_State *GG_local;
  
  for (i = 0; i < 0x59; i = i + 1) {
    uVar1 = lj_bc_ofs[i];
    GG->dispatch[i] = lj_BC_ISLT + (int)(uint)uVar1;
    GG->dispatch[i + 0x9a] = lj_BC_ISLT + (int)(uint)uVar1;
  }
  for (i = 0x59; i < 0x9a; i = i + 1) {
    GG->dispatch[i] = lj_BC_ISLT + (int)(uint)lj_bc_ofs[i];
  }
  GG->dispatch[0x4f] = GG->dispatch[0x50];
  GG->dispatch[0x52] = GG->dispatch[0x53];
  GG->dispatch[0x55] = GG->dispatch[0x56];
  GG->dispatch[0x59] = GG->dispatch[0x5a];
  GG->dispatch[0x5c] = GG->dispatch[0x5d];
  (GG->g).bc_cfunc_int = 0x145f;
  (GG->g).bc_cfunc_ext = 0x145f;
  for (i = 0; i < 0x39; i = i + 1) {
    GG->bcff[i] = i + 0x61;
  }
  return;
}

Assistant:

void lj_dispatch_init(GG_State *GG)
{
  uint32_t i;
  ASMFunction *disp = GG->dispatch;
  for (i = 0; i < GG_LEN_SDISP; i++)
    disp[GG_LEN_DDISP+i] = disp[i] = makeasmfunc(lj_bc_ofs[i]);
  for (i = GG_LEN_SDISP; i < GG_LEN_DDISP; i++)
    disp[i] = makeasmfunc(lj_bc_ofs[i]);
  /* The JIT engine is off by default. luaopen_jit() turns it on. */
  disp[BC_FORL] = disp[BC_IFORL];
  disp[BC_ITERL] = disp[BC_IITERL];
  disp[BC_LOOP] = disp[BC_ILOOP];
  disp[BC_FUNCF] = disp[BC_IFUNCF];
  disp[BC_FUNCV] = disp[BC_IFUNCV];
  GG->g.bc_cfunc_ext = GG->g.bc_cfunc_int = BCINS_AD(BC_FUNCC, LUA_MINSTACK, 0);
  for (i = 0; i < GG_NUM_ASMFF; i++)
    GG->bcff[i] = BCINS_AD(BC__MAX+i, 0, 0);
#if LJ_TARGET_MIPS
  memcpy(GG->got, dispatch_got, LJ_GOT__MAX*sizeof(ASMFunction *));
#endif
}